

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::CopyImage::MissMatchObjectTest::iterate(MissMatchObjectTest *this)

{
  pointer ptVar1;
  ostringstream *this_00;
  GLenum GVar2;
  pointer ptVar3;
  Context *pCVar4;
  int iVar5;
  GLuint GVar6;
  GLenum GVar7;
  IterateResult IVar8;
  undefined4 extraout_var;
  uint uVar9;
  GLuint temp;
  Enum<int,_2UL> local_200;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  temp = 0;
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = ptVar3 + this->m_test_case_index;
  GVar2 = ptVar3[this->m_test_case_index].m_obj_target;
  pCVar4 = (this->super_TestCase).m_context;
  if (GVar2 == 0x8d41) {
    GVar6 = Utils::prepareRenderBuffer(pCVar4,0x8058);
    this->m_dst_name = GVar6;
    GVar6 = Utils::prepareRenderBuffer((this->super_TestCase).m_context,0x8058);
    this->m_src_name = GVar6;
  }
  else {
    GVar6 = Utils::generateTexture(pCVar4,GVar2);
    Utils::prepareTexture(pCVar4,GVar6,GVar2,0x8058,0x1908,0x1401,0,0x10,0x10,6,(GLvoid *)0x0,&temp)
    ;
    this->m_dst_name = GVar6;
    pCVar4 = (this->super_TestCase).m_context;
    GVar2 = ptVar1->m_obj_target;
    GVar6 = Utils::generateTexture(pCVar4,GVar2);
    Utils::prepareTexture(pCVar4,GVar6,GVar2,0x8058,0x1908,0x1401,0,0x10,0x10,6,(GLvoid *)0x0,&temp)
    ;
    this->m_src_name = GVar6;
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,ptVar1->m_obj_target,this->m_dst_name,0,0);
    Utils::makeTextureComplete
              ((this->super_TestCase).m_context,ptVar1->m_obj_target,this->m_src_name,0,0);
  }
  (**(code **)(CONCAT44(extraout_var,iVar5) + 0x310))
            (this->m_src_name,ptVar1->m_src_target,0,0,0,0,this->m_dst_name,ptVar1->m_dst_target,0,0
             ,0,0,1,1,1);
  GVar7 = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
  GVar2 = ptVar1->m_expected_result;
  clean(this);
  if (GVar2 == GVar7) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar9 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar9;
    IVar8 = (IterateResult)
            ((ulong)uVar9 <
            (ulong)((long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::MissMatchObjectTest::testCase,_std::allocator<gl4cts::CopyImage::MissMatchObjectTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Failure. Expected result: ",0x1a);
    local_1c0.m_value = ptVar1->m_expected_result;
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got: ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar7;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Object target: ",0x11);
    local_1e0.m_value = ptVar1->m_obj_target;
    local_1e0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Source target: ",0x11);
    local_1f0.m_value = ptVar1->m_src_target;
    local_1f0.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Destination target: ",0x16);
    local_200.m_value = ptVar1->m_dst_target;
    local_200.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_200,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar8 = STOP;
  }
  return IVar8;
}

Assistant:

tcu::TestNode::IterateResult MissMatchObjectTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare objects */
		if (GL_RENDERBUFFER == test_case.m_obj_target)
		{
			m_dst_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
			m_src_name = Utils::prepareRenderBuffer(m_context, GL_RGBA8);
		}
		else
		{
			m_dst_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);
			m_src_name =
				Utils::prepareTex16x16x6(m_context, test_case.m_obj_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);

			/* Make textures complete */
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_dst_name, 0 /* base */, 0 /* max */);
			Utils::makeTextureComplete(m_context, test_case.m_obj_target, m_src_name, 0 /* base */, 0 /* max */);
		}
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_name, test_case.m_src_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */, 0 /* srcZ */,
						m_dst_name, test_case.m_dst_target, 0 /* dstLevel */, 0 /* dstX */, 0 /* dstY */, 0 /* dstZ */,
						1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Object target: " << glu::getTextureTargetStr(test_case.m_obj_target)
			<< ". Source target: " << glu::getTextureTargetStr(test_case.m_src_target)
			<< ". Destination target: " << glu::getTextureTargetStr(test_case.m_dst_target) << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}